

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DebuggerScope * __thiscall
Js::FunctionBody::AddScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation)

{
  code *pcVar1;
  bool bVar2;
  ScopeObjectChain *pSVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  DebuggerScope *this_00;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01
  ;
  TrackAllocData local_50;
  DebuggerScope *local_28;
  DebuggerScope *scopeObject;
  int local_18;
  RegSlot scopeLocation_local;
  int start_local;
  DiagExtraScopesType scopeType_local;
  FunctionBody *this_local;
  
  scopeObject._4_4_ = scopeLocation;
  local_18 = start;
  scopeLocation_local = scopeType;
  _start_local = this;
  pSVar3 = GetScopeObjectChain(this);
  if (pSVar3 == (ScopeObjectChain *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ef1,"(GetScopeObjectChain())","GetScopeObjectChain()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&DebuggerScope::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1ef3);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
  this_00 = (DebuggerScope *)new<Memory::Recycler>(0x40,pRVar5,0x43c4b0);
  pRVar5 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  DebuggerScope::DebuggerScope(this_00,pRVar5,scopeLocation_local,scopeObject._4_4_,local_18);
  local_28 = this_00;
  pSVar3 = GetScopeObjectChain(this);
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            ::operator->(&pSVar3->pScopeChain);
  JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_01,&local_28);
  return local_28;
}

Assistant:

DebuggerScope * FunctionBody::AddScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation)
    {
        Assert(GetScopeObjectChain());

        DebuggerScope *scopeObject = RecyclerNew(m_scriptContext->GetRecycler(), DebuggerScope, m_scriptContext->GetRecycler(), scopeType, scopeLocation, start);
        GetScopeObjectChain()->pScopeChain->Add(scopeObject);

        return scopeObject;
    }